

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_string.c
# Opt level: O0

int lj_ffh_string_char(lua_State *L)

{
  long lVar1;
  long lVar2;
  char *pcVar3;
  undefined4 *puVar4;
  GCstr *pGVar5;
  long in_RDI;
  int32_t k;
  char *buf;
  int nargs;
  int i;
  undefined8 in_stack_ffffffffffffff68;
  lua_State *in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff78;
  uint in_stack_ffffffffffffff7c;
  int local_74;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  char *in_stack_ffffffffffffffd8;
  lua_State *in_stack_ffffffffffffffe0;
  
  lVar1 = *(long *)(in_RDI + 0x18);
  lVar2 = *(long *)(in_RDI + 0x10);
  pcVar3 = lj_buf_tmp((lua_State *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                      (MSize)((ulong)in_stack_ffffffffffffff70 >> 0x20));
  local_74 = 1;
  while( true ) {
    if ((int)(lVar1 - lVar2 >> 3) < local_74) {
      puVar4 = (undefined4 *)(*(long *)(in_RDI + 0x10) + -8);
      pGVar5 = lj_str_new(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,
                          CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
      *puVar4 = (int)pGVar5;
      puVar4[1] = 0xfffffffb;
      return 2;
    }
    in_stack_ffffffffffffff7c =
         lj_lib_checkint((lua_State *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                         (int)((ulong)in_stack_ffffffffffffff70 >> 0x20));
    if (in_stack_ffffffffffffff7c != (in_stack_ffffffffffffff7c & 0xff)) break;
    pcVar3[local_74 + -1] = (char)in_stack_ffffffffffffff7c;
    local_74 = local_74 + 1;
  }
  lj_err_arg(in_stack_ffffffffffffff70,(int)((ulong)in_stack_ffffffffffffff68 >> 0x20),
             (ErrMsg)in_stack_ffffffffffffff68);
}

Assistant:

LJLIB_ASM(string_char)		LJLIB_REC(.)
{
  int i, nargs = (int)(L->top - L->base);
  char *buf = lj_buf_tmp(L, (MSize)nargs);
  for (i = 1; i <= nargs; i++) {
    int32_t k = lj_lib_checkint(L, i);
    if (!checku8(k))
      lj_err_arg(L, i, LJ_ERR_BADVAL);
    buf[i-1] = (char)k;
  }
  setstrV(L, L->base-1-LJ_FR2, lj_str_new(L, buf, (size_t)nargs));
  return FFH_RES(1);
}